

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall
Json::OurReader::pushError(OurReader *this,Value *value,string *message,Value *extra)

{
  bool bVar1;
  long lVar2;
  undefined1 local_58 [24];
  _Alloc_hider local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  Location local_20;
  
  local_58._16_8_ = this->begin_;
  lVar2 = (long)this->end_ - local_58._16_8_;
  if (lVar2 < value->start_) {
    bVar1 = false;
  }
  else {
    bVar1 = false;
    if ((value->limit_ <= lVar2) && (bVar1 = false, extra->limit_ <= lVar2)) {
      local_58._8_8_ = local_58._16_8_ + value->start_;
      local_58._16_8_ = local_58._16_8_ + value->limit_;
      local_38 = 0;
      local_30._M_local_buf[0] = '\0';
      local_58._0_4_ = tokenError;
      local_40._M_p = (pointer)&local_30;
      std::__cxx11::string::_M_assign((string *)&local_40);
      local_20 = this->begin_ + extra->start_;
      std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::push_back
                (&this->errors_,(value_type *)local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_p != &local_30) {
        operator_delete(local_40._M_p);
      }
      bVar1 = true;
    }
  }
  return bVar1;
}

Assistant:

bool OurReader::pushError(const Value& value, const JSONCPP_STRING& message, const Value& extra) {
  ptrdiff_t length = end_ - begin_;
  if(value.getOffsetStart() > length
    || value.getOffsetLimit() > length
    || extra.getOffsetLimit() > length)
    return false;
  Token token;
  token.type_ = tokenError;
  token.start_ = begin_ + value.getOffsetStart();
  token.end_ = begin_ + value.getOffsetLimit();
  ErrorInfo info;
  info.token_ = token;
  info.message_ = message;
  info.extra_ = begin_ + extra.getOffsetStart();
  errors_.push_back(info);
  return true;
}